

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  BufferView<embree::Vec3fa> *pBVar9;
  float fVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined4 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [12];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar60;
  float fVar63;
  float fVar64;
  undefined1 auVar61 [16];
  float fVar65;
  undefined1 auVar62 [16];
  vfloat4 b0;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vfloat4 a0_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  __m128 a_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  float fVar80;
  float fVar81;
  undefined1 auVar78 [16];
  float fVar82;
  undefined1 auVar79 [32];
  float fVar83;
  vfloat4 a0_2;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vfloat4 b0_1;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar93 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  float fVar99;
  float fVar105;
  float fVar106;
  undefined1 auVar100 [16];
  float fVar107;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  vfloat4 a0;
  undefined1 auVar108 [16];
  
  pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar4 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  uVar12 = (ulong)uVar4;
  pcVar6 = pBVar5[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar5[itime].super_RawBufferView.stride;
  lVar16 = sVar7 * uVar12;
  uVar13 = (ulong)(uVar4 + 1);
  lVar11 = sVar7 * uVar13;
  pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar8 = pBVar5[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar5[itime].super_RawBufferView.stride;
  lVar15 = sVar7 * uVar12;
  lVar14 = sVar7 * uVar13;
  fVar77 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar23 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar16),
                          ZEXT416((uint)(fVar77 * *(float *)(pcVar6 + lVar16 + 0xc))),0x30);
  auVar21 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar11),
                          ZEXT416((uint)(fVar77 * *(float *)(pcVar6 + lVar11 + 0xc))),0x30);
  auVar25 = vinsertps_avx(*(undefined1 (*) [16])(pcVar8 + lVar15),
                          ZEXT416((uint)(fVar77 * *(float *)(pcVar8 + lVar15 + 0xc))),0x30);
  auVar19 = vinsertps_avx(*(undefined1 (*) [16])(pcVar8 + lVar14),
                          ZEXT416((uint)(fVar77 * *(float *)(pcVar8 + lVar14 + 0xc))),0x30);
  auVar66._8_4_ = 0xbeaaaaab;
  auVar66._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar66._12_4_ = 0xbeaaaaab;
  auVar24 = vfnmadd213ps_fma(auVar25,auVar66,auVar23);
  pBVar9 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           normals.items;
  pcVar6 = pBVar9[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar9[itime].super_RawBufferView.stride;
  auVar25 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar12);
  auVar51 = vfmadd213ps_fma(auVar19,auVar66,auVar21);
  auVar19 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar13);
  pBVar9 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           dnormals.items;
  pcVar6 = pBVar9[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar9[itime].super_RawBufferView.stride;
  auVar22 = vfnmadd132ps_fma(*(undefined1 (*) [16])(pcVar6 + uVar12 * sVar7),auVar25,auVar66);
  auVar47 = vfmadd132ps_fma(auVar66,auVar19,*(undefined1 (*) [16])(pcVar6 + sVar7 * uVar13));
  auVar52 = ZEXT816(0) << 0x20;
  auVar48._0_4_ = auVar21._0_4_ * 0.0;
  auVar48._4_4_ = auVar21._4_4_ * 0.0;
  auVar48._8_4_ = auVar21._8_4_ * 0.0;
  auVar48._12_4_ = auVar21._12_4_ * 0.0;
  auVar20 = vfmadd231ps_fma(auVar48,auVar51,auVar52);
  auVar48 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar24,auVar20);
  auVar17 = vaddps_avx512vl(auVar23,auVar48);
  auVar100._8_4_ = 0x40400000;
  auVar100._0_8_ = 0x4040000040400000;
  auVar100._12_4_ = 0x40400000;
  auVar48 = vfmadd231ps_fma(auVar20,auVar24,auVar100);
  auVar49 = vfnmadd231ps_fma(auVar48,auVar23,auVar100);
  auVar108._0_4_ = auVar19._0_4_ * 0.0;
  auVar108._4_4_ = auVar19._4_4_ * 0.0;
  auVar108._8_4_ = auVar19._8_4_ * 0.0;
  auVar108._12_4_ = auVar19._12_4_ * 0.0;
  auVar20 = vfmadd231ps_fma(auVar108,auVar47,auVar52);
  auVar48 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar22,auVar20);
  auVar18 = vaddps_avx512vl(auVar25,auVar48);
  auVar48 = vfmadd231ps_fma(auVar20,auVar22,auVar100);
  auVar20 = vfnmadd231ps_fma(auVar48,auVar25,auVar100);
  auVar48 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar51,auVar21);
  auVar48 = vfmadd231ps_fma(auVar48,auVar24,auVar52);
  auVar48 = vfmadd231ps_fma(auVar48,auVar23,auVar52);
  auVar61._0_4_ = auVar21._0_4_ * 3.0;
  auVar61._4_4_ = auVar21._4_4_ * 3.0;
  auVar61._8_4_ = auVar21._8_4_ * 3.0;
  auVar61._12_4_ = auVar21._12_4_ * 3.0;
  auVar21 = vfnmadd231ps_fma(auVar61,auVar100,auVar51);
  auVar21 = vfmadd231ps_fma(auVar21,auVar52,auVar24);
  auVar24 = vfnmadd231ps_fma(auVar21,auVar52,auVar23);
  auVar23 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar47,auVar19);
  auVar23 = vfmadd231ps_fma(auVar23,auVar22,auVar52);
  auVar51 = vfmadd231ps_fma(auVar23,auVar25,auVar52);
  auVar84._0_4_ = auVar19._0_4_ * 3.0;
  auVar84._4_4_ = auVar19._4_4_ * 3.0;
  auVar84._8_4_ = auVar19._8_4_ * 3.0;
  auVar84._12_4_ = auVar19._12_4_ * 3.0;
  auVar19 = vfnmadd231ps_fma(auVar84,auVar100,auVar47);
  auVar19 = vfmadd231ps_fma(auVar19,auVar52,auVar22);
  auVar22 = vfnmadd231ps_fma(auVar19,auVar52,auVar25);
  auVar25 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar19 = vshufps_avx512vl(auVar18,auVar18,0xc9);
  fVar77 = auVar49._0_4_;
  auVar75._0_4_ = auVar19._0_4_ * fVar77;
  fVar80 = auVar49._4_4_;
  auVar75._4_4_ = auVar19._4_4_ * fVar80;
  fVar81 = auVar49._8_4_;
  auVar75._8_4_ = auVar19._8_4_ * fVar81;
  fVar82 = auVar49._12_4_;
  auVar75._12_4_ = auVar19._12_4_ * fVar82;
  auVar19 = vfmsub231ps_avx512vl(auVar75,auVar25,auVar18);
  auVar23 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar19 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar78._0_4_ = auVar19._0_4_ * fVar77;
  auVar78._4_4_ = auVar19._4_4_ * fVar80;
  auVar78._8_4_ = auVar19._8_4_ * fVar81;
  auVar78._12_4_ = auVar19._12_4_ * fVar82;
  auVar25 = vfmsub231ps_fma(auVar78,auVar25,auVar20);
  auVar21 = vshufps_avx(auVar25,auVar25,0xc9);
  auVar19 = vshufps_avx(auVar24,auVar24,0xc9);
  auVar25 = vshufps_avx(auVar51,auVar51,0xc9);
  fVar60 = auVar24._0_4_;
  auVar67._0_4_ = fVar60 * auVar25._0_4_;
  fVar63 = auVar24._4_4_;
  auVar67._4_4_ = fVar63 * auVar25._4_4_;
  fVar64 = auVar24._8_4_;
  auVar67._8_4_ = fVar64 * auVar25._8_4_;
  fVar65 = auVar24._12_4_;
  auVar67._12_4_ = fVar65 * auVar25._12_4_;
  auVar25 = vfmsub231ps_fma(auVar67,auVar19,auVar51);
  auVar47 = vshufps_avx(auVar25,auVar25,0xc9);
  auVar51 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar25 = vdpps_avx(auVar23,auVar23,0x7f);
  auVar70._0_4_ = fVar60 * auVar51._0_4_;
  auVar70._4_4_ = fVar63 * auVar51._4_4_;
  auVar70._8_4_ = fVar64 * auVar51._8_4_;
  auVar70._12_4_ = fVar65 * auVar51._12_4_;
  auVar19 = vfmsub231ps_fma(auVar70,auVar19,auVar22);
  auVar51 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar59 = SUB1612(ZEXT816(0),0);
  auVar85._4_12_ = auVar59;
  auVar85._0_4_ = auVar25._0_4_;
  auVar19 = vrsqrt14ss_avx512f(auVar52,auVar85);
  fVar50 = auVar19._0_4_;
  auVar20 = vmulss_avx512f(auVar25,SUB6416(ZEXT464(0x3f000000),0));
  auVar19 = vmulss_avx512f(auVar20,auVar19);
  auVar20 = vmulss_avx512f(auVar19,ZEXT416((uint)(fVar50 * fVar50)));
  auVar19 = vdpps_avx(auVar23,auVar21,0x7f);
  fVar10 = fVar50 * 1.5 - auVar20._0_4_;
  fVar99 = auVar23._0_4_ * fVar10;
  fVar105 = auVar23._4_4_ * fVar10;
  fVar106 = auVar23._8_4_ * fVar10;
  fVar107 = auVar23._12_4_ * fVar10;
  auVar20 = vbroadcastss_avx512vl(auVar25);
  auVar21 = vmulps_avx512vl(auVar20,auVar21);
  fVar50 = auVar19._0_4_;
  auVar18._0_4_ = auVar23._0_4_ * fVar50;
  auVar18._4_4_ = auVar23._4_4_ * fVar50;
  auVar18._8_4_ = auVar23._8_4_ * fVar50;
  auVar18._12_4_ = auVar23._12_4_ * fVar50;
  auVar23 = vsubps_avx(auVar21,auVar18);
  auVar19 = vrcp14ss_avx512f(auVar52,auVar85);
  auVar25 = vfnmadd213ss_fma(auVar25,auVar19,SUB6416(ZEXT464(0x40000000),0));
  fVar50 = auVar19._0_4_ * auVar25._0_4_;
  auVar25 = vdpps_avx(auVar47,auVar47,0x7f);
  fVar83 = auVar25._0_4_;
  auVar76._4_12_ = auVar59;
  auVar76._0_4_ = fVar83;
  auVar19 = vrsqrt14ss_avx512f(auVar52,auVar76);
  fVar91 = auVar19._0_4_;
  fVar91 = fVar91 * 1.5 - fVar83 * 0.5 * fVar91 * fVar91 * fVar91;
  fVar92 = fVar91 * auVar47._0_4_;
  fVar94 = fVar91 * auVar47._4_4_;
  fVar95 = fVar91 * auVar47._8_4_;
  fVar96 = fVar91 * auVar47._12_4_;
  auVar19 = vdpps_avx(auVar47,auVar51,0x7f);
  auVar71._0_4_ = fVar83 * auVar51._0_4_;
  auVar71._4_4_ = fVar83 * auVar51._4_4_;
  auVar71._8_4_ = fVar83 * auVar51._8_4_;
  auVar71._12_4_ = fVar83 * auVar51._12_4_;
  fVar83 = auVar19._0_4_;
  auVar68._0_4_ = fVar83 * auVar47._0_4_;
  auVar68._4_4_ = fVar83 * auVar47._4_4_;
  auVar68._8_4_ = fVar83 * auVar47._8_4_;
  auVar68._12_4_ = fVar83 * auVar47._12_4_;
  auVar21 = vsubps_avx(auVar71,auVar68);
  auVar19 = vrcp14ss_avx512f(auVar52,auVar76);
  auVar25 = vfnmadd213ss_fma(auVar25,auVar19,SUB6416(ZEXT464(0x40000000),0));
  fVar83 = auVar25._0_4_ * auVar19._0_4_;
  auVar19 = vshufps_avx512vl(auVar17,auVar17,0xff);
  auVar72._0_4_ = fVar99 * auVar19._0_4_;
  auVar72._4_4_ = fVar105 * auVar19._4_4_;
  auVar72._8_4_ = fVar106 * auVar19._8_4_;
  auVar72._12_4_ = fVar107 * auVar19._12_4_;
  auVar20 = vsubps_avx512vl(auVar17,auVar72);
  auVar25 = vshufps_avx(auVar49,auVar49,0xff);
  auVar51._0_4_ = auVar25._0_4_ * fVar99 + auVar19._0_4_ * fVar10 * fVar50 * auVar23._0_4_;
  auVar51._4_4_ = auVar25._4_4_ * fVar105 + auVar19._4_4_ * fVar10 * fVar50 * auVar23._4_4_;
  auVar51._8_4_ = auVar25._8_4_ * fVar106 + auVar19._8_4_ * fVar10 * fVar50 * auVar23._8_4_;
  auVar51._12_4_ = auVar25._12_4_ * fVar107 + auVar19._12_4_ * fVar10 * fVar50 * auVar23._12_4_;
  auVar23 = vsubps_avx(auVar49,auVar51);
  auVar22 = vaddps_avx512vl(auVar17,auVar72);
  auVar25 = vshufps_avx(auVar48,auVar48,0xff);
  auVar73._0_4_ = fVar92 * auVar25._0_4_;
  auVar73._4_4_ = fVar94 * auVar25._4_4_;
  auVar73._8_4_ = fVar95 * auVar25._8_4_;
  auVar73._12_4_ = fVar96 * auVar25._12_4_;
  auVar47 = vsubps_avx(auVar48,auVar73);
  auVar19 = vshufps_avx(auVar24,auVar24,0xff);
  auVar57._0_4_ = auVar19._0_4_ * fVar92 + auVar25._0_4_ * fVar91 * auVar21._0_4_ * fVar83;
  auVar57._4_4_ = auVar19._4_4_ * fVar94 + auVar25._4_4_ * fVar91 * auVar21._4_4_ * fVar83;
  auVar57._8_4_ = auVar19._8_4_ * fVar95 + auVar25._8_4_ * fVar91 * auVar21._8_4_ * fVar83;
  auVar57._12_4_ = auVar19._12_4_ * fVar96 + auVar25._12_4_ * fVar91 * auVar21._12_4_ * fVar83;
  auVar25 = vsubps_avx(auVar24,auVar57);
  auVar17._0_4_ = auVar48._0_4_ + auVar73._0_4_;
  auVar17._4_4_ = auVar48._4_4_ + auVar73._4_4_;
  auVar17._8_4_ = auVar48._8_4_ + auVar73._8_4_;
  auVar17._12_4_ = auVar48._12_4_ + auVar73._12_4_;
  auVar86._0_4_ = auVar20._0_4_ + auVar23._0_4_ * 0.33333334;
  auVar86._4_4_ = auVar20._4_4_ + auVar23._4_4_ * 0.33333334;
  auVar86._8_4_ = auVar20._8_4_ + auVar23._8_4_ * 0.33333334;
  auVar86._12_4_ = auVar20._12_4_ + auVar23._12_4_ * 0.33333334;
  auVar62._0_4_ = auVar25._0_4_ * 0.33333334;
  auVar62._4_4_ = auVar25._4_4_ * 0.33333334;
  auVar62._8_4_ = auVar25._8_4_ * 0.33333334;
  auVar62._12_4_ = auVar25._12_4_ * 0.33333334;
  auVar21 = vsubps_avx(auVar47,auVar62);
  auVar24._0_4_ = auVar22._0_4_ + (fVar77 + auVar51._0_4_) * 0.33333334;
  auVar24._4_4_ = auVar22._4_4_ + (fVar80 + auVar51._4_4_) * 0.33333334;
  auVar24._8_4_ = auVar22._8_4_ + (fVar81 + auVar51._8_4_) * 0.33333334;
  auVar24._12_4_ = auVar22._12_4_ + (fVar82 + auVar51._12_4_) * 0.33333334;
  auVar55._0_4_ = (fVar60 + auVar57._0_4_) * 0.33333334;
  auVar55._4_4_ = (fVar63 + auVar57._4_4_) * 0.33333334;
  auVar55._8_4_ = (fVar64 + auVar57._8_4_) * 0.33333334;
  auVar55._12_4_ = (fVar65 + auVar57._12_4_) * 0.33333334;
  auVar51 = vsubps_avx(auVar17,auVar55);
  aVar1 = ofs->field_0;
  auVar25 = vsubps_avx(auVar20,(undefined1  [16])aVar1);
  auVar23._0_4_ = scale * auVar25._0_4_;
  auVar23._4_4_ = scale * auVar25._4_4_;
  auVar23._8_4_ = scale * auVar25._8_4_;
  auVar23._12_4_ = scale * auVar25._12_4_;
  auVar101._4_4_ = auVar23._0_4_;
  auVar101._0_4_ = auVar23._0_4_;
  auVar101._8_4_ = auVar23._0_4_;
  auVar101._12_4_ = auVar23._0_4_;
  auVar19 = vshufps_avx(auVar23,auVar23,0x55);
  aVar2 = (space->vx).field_0;
  auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
  aVar3 = (space->vy).field_0;
  auVar25 = *(undefined1 (*) [16])(space->vz).field_0.m128;
  fVar77 = auVar25._0_4_;
  auVar56._0_4_ = fVar77 * auVar23._0_4_;
  fVar80 = auVar25._4_4_;
  auVar56._4_4_ = fVar80 * auVar23._4_4_;
  fVar81 = auVar25._8_4_;
  auVar56._8_4_ = fVar81 * auVar23._8_4_;
  fVar82 = auVar25._12_4_;
  auVar56._12_4_ = fVar82 * auVar23._12_4_;
  auVar19 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar3,auVar19);
  auVar48 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar2,auVar101);
  auVar19 = vsubps_avx(auVar86,(undefined1  [16])aVar1);
  auVar20._0_4_ = scale * auVar19._0_4_;
  auVar20._4_4_ = scale * auVar19._4_4_;
  auVar20._8_4_ = scale * auVar19._8_4_;
  auVar20._12_4_ = scale * auVar19._12_4_;
  auVar102._4_4_ = auVar20._0_4_;
  auVar102._0_4_ = auVar20._0_4_;
  auVar102._8_4_ = auVar20._0_4_;
  auVar102._12_4_ = auVar20._0_4_;
  auVar19 = vshufps_avx(auVar20,auVar20,0x55);
  auVar23 = vshufps_avx(auVar20,auVar20,0xaa);
  auVar87._0_4_ = fVar77 * auVar23._0_4_;
  auVar87._4_4_ = fVar80 * auVar23._4_4_;
  auVar87._8_4_ = fVar81 * auVar23._8_4_;
  auVar87._12_4_ = fVar82 * auVar23._12_4_;
  auVar19 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar3,auVar19);
  auVar20 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar2,auVar102);
  auVar19 = vsubps_avx(auVar21,(undefined1  [16])aVar1);
  auVar21._0_4_ = scale * auVar19._0_4_;
  auVar21._4_4_ = scale * auVar19._4_4_;
  auVar21._8_4_ = scale * auVar19._8_4_;
  auVar21._12_4_ = scale * auVar19._12_4_;
  auVar103._4_4_ = auVar21._0_4_;
  auVar103._0_4_ = auVar21._0_4_;
  auVar103._8_4_ = auVar21._0_4_;
  auVar103._12_4_ = auVar21._0_4_;
  auVar19 = vshufps_avx(auVar21,auVar21,0x55);
  auVar23 = vshufps_avx(auVar21,auVar21,0xaa);
  auVar93._0_4_ = fVar77 * auVar23._0_4_;
  auVar93._4_4_ = fVar80 * auVar23._4_4_;
  auVar93._8_4_ = fVar81 * auVar23._8_4_;
  auVar93._12_4_ = fVar82 * auVar23._12_4_;
  auVar19 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar3,auVar19);
  auVar21 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar2,auVar103);
  auVar19 = vsubps_avx(auVar47,(undefined1  [16])aVar1);
  auVar47._0_4_ = scale * auVar19._0_4_;
  auVar47._4_4_ = scale * auVar19._4_4_;
  auVar47._8_4_ = scale * auVar19._8_4_;
  auVar47._12_4_ = scale * auVar19._12_4_;
  auVar104._4_4_ = auVar47._0_4_;
  auVar104._0_4_ = auVar47._0_4_;
  auVar104._8_4_ = auVar47._0_4_;
  auVar104._12_4_ = auVar47._0_4_;
  auVar19 = vshufps_avx(auVar47,auVar47,0x55);
  auVar23 = vshufps_avx(auVar47,auVar47,0xaa);
  auVar97._0_4_ = fVar77 * auVar23._0_4_;
  auVar97._4_4_ = fVar80 * auVar23._4_4_;
  auVar97._8_4_ = fVar81 * auVar23._8_4_;
  auVar97._12_4_ = fVar82 * auVar23._12_4_;
  auVar19 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar3,auVar19);
  auVar47 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar2,auVar104);
  auVar19 = vsubps_avx(auVar22,(undefined1  [16])aVar1);
  auVar22._0_4_ = scale * auVar19._0_4_;
  auVar22._4_4_ = scale * auVar19._4_4_;
  auVar22._8_4_ = scale * auVar19._8_4_;
  auVar22._12_4_ = scale * auVar19._12_4_;
  auVar88._4_4_ = auVar22._0_4_;
  auVar88._0_4_ = auVar22._0_4_;
  auVar88._8_4_ = auVar22._0_4_;
  auVar88._12_4_ = auVar22._0_4_;
  auVar19 = vshufps_avx(auVar22,auVar22,0x55);
  auVar23 = vshufps_avx(auVar22,auVar22,0xaa);
  auVar23 = vmulps_avx512vl(auVar25,auVar23);
  auVar19 = vfmadd231ps_avx512vl(auVar23,(undefined1  [16])aVar3,auVar19);
  auVar22 = vfmadd231ps_avx512vl(auVar19,(undefined1  [16])aVar2,auVar88);
  auVar19 = vsubps_avx(auVar24,(undefined1  [16])aVar1);
  auVar49._0_4_ = scale * auVar19._0_4_;
  auVar49._4_4_ = scale * auVar19._4_4_;
  auVar49._8_4_ = scale * auVar19._8_4_;
  auVar49._12_4_ = scale * auVar19._12_4_;
  auVar89._4_4_ = auVar49._0_4_;
  auVar89._0_4_ = auVar49._0_4_;
  auVar89._8_4_ = auVar49._0_4_;
  auVar89._12_4_ = auVar49._0_4_;
  auVar19 = vshufps_avx(auVar49,auVar49,0x55);
  auVar23 = vshufps_avx(auVar49,auVar49,0xaa);
  auVar23 = vmulps_avx512vl(auVar25,auVar23);
  auVar19 = vfmadd231ps_avx512vl(auVar23,(undefined1  [16])aVar3,auVar19);
  auVar24 = vfmadd231ps_avx512vl(auVar19,(undefined1  [16])aVar2,auVar89);
  auVar19 = vsubps_avx(auVar51,(undefined1  [16])aVar1);
  auVar58._0_4_ = scale * auVar19._0_4_;
  auVar58._4_4_ = scale * auVar19._4_4_;
  auVar58._8_4_ = scale * auVar19._8_4_;
  auVar58._12_4_ = scale * auVar19._12_4_;
  auVar90._4_4_ = auVar58._0_4_;
  auVar90._0_4_ = auVar58._0_4_;
  auVar90._8_4_ = auVar58._0_4_;
  auVar90._12_4_ = auVar58._0_4_;
  auVar19 = vshufps_avx(auVar58,auVar58,0x55);
  auVar23 = vshufps_avx(auVar58,auVar58,0xaa);
  auVar25 = vmulps_avx512vl(auVar25,auVar23);
  auVar25 = vfmadd231ps_avx512vl(auVar25,(undefined1  [16])aVar3,auVar19);
  auVar23 = vfmadd231ps_avx512vl(auVar25,(undefined1  [16])aVar2,auVar90);
  auVar25 = vsubps_avx(auVar17,(undefined1  [16])aVar1);
  auVar52._0_4_ = scale * auVar25._0_4_;
  auVar52._4_4_ = scale * auVar25._4_4_;
  auVar52._8_4_ = scale * auVar25._8_4_;
  auVar52._12_4_ = scale * auVar25._12_4_;
  auVar74._4_4_ = auVar52._0_4_;
  auVar74._0_4_ = auVar52._0_4_;
  auVar74._8_4_ = auVar52._0_4_;
  auVar74._12_4_ = auVar52._0_4_;
  auVar25 = vshufps_avx(auVar52,auVar52,0x55);
  auVar19 = vshufps_avx(auVar52,auVar52,0xaa);
  auVar69._0_4_ = fVar77 * auVar19._0_4_;
  auVar69._4_4_ = fVar80 * auVar19._4_4_;
  auVar69._8_4_ = fVar81 * auVar19._8_4_;
  auVar69._12_4_ = fVar82 * auVar19._12_4_;
  auVar25 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar3,auVar25);
  auVar25 = vfmadd231ps_fma(auVar25,(undefined1  [16])aVar2,auVar74);
  auVar26 = vbroadcastss_avx512vl(ZEXT416(1));
  uVar54 = auVar48._0_4_;
  auVar42._4_4_ = uVar54;
  auVar42._0_4_ = uVar54;
  auVar42._8_4_ = uVar54;
  auVar42._12_4_ = uVar54;
  auVar42._16_4_ = uVar54;
  auVar42._20_4_ = uVar54;
  auVar42._24_4_ = uVar54;
  auVar42._28_4_ = uVar54;
  auVar27 = vpermps_avx512vl(auVar26,ZEXT1632(auVar48));
  auVar28 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar29 = vpermps_avx512vl(auVar28,ZEXT1632(auVar48));
  auVar30 = vbroadcastss_avx512vl(auVar20);
  auVar31 = vpermps_avx512vl(auVar26,ZEXT1632(auVar20));
  auVar32 = vpermps_avx512vl(auVar28,ZEXT1632(auVar20));
  auVar33 = vbroadcastss_avx512vl(auVar21);
  auVar34 = vpermps_avx512vl(auVar26,ZEXT1632(auVar21));
  auVar35 = vpermps_avx512vl(auVar28,ZEXT1632(auVar21));
  auVar36 = vbroadcastss_avx512vl(auVar47);
  auVar37 = vpermps_avx512vl(auVar26,ZEXT1632(auVar47));
  auVar38 = vpermps_avx512vl(auVar28,ZEXT1632(auVar47));
  auVar39 = vmulps_avx512vl(auVar36,bezier_basis0._3944_32_);
  auVar40 = vmulps_avx512vl(auVar37,bezier_basis0._3944_32_);
  auVar41 = vmulps_avx512vl(auVar38,bezier_basis0._3944_32_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._2788_32_,auVar33);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._2788_32_,auVar34);
  auVar41 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._2788_32_,auVar35);
  auVar39 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._1632_32_,auVar30);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._1632_32_,auVar31);
  auVar41 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._1632_32_,auVar32);
  auVar19 = vfmadd231ps_fma(auVar39,bezier_basis0._476_32_,auVar42);
  auVar39 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._476_32_,auVar27);
  auVar40 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._476_32_,auVar29);
  auVar36 = vmulps_avx512vl(auVar36,bezier_basis0._8568_32_);
  auVar37 = vmulps_avx512vl(auVar37,bezier_basis0._8568_32_);
  auVar38 = vmulps_avx512vl(auVar38,bezier_basis0._8568_32_);
  auVar33 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._7412_32_,auVar33);
  auVar34 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._7412_32_,auVar34);
  auVar35 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._7412_32_,auVar35);
  auVar30 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._6256_32_,auVar30);
  auVar31 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._6256_32_,auVar31);
  auVar32 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._6256_32_,auVar32);
  auVar30 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._5100_32_,auVar42);
  auVar27 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._5100_32_,auVar27);
  auVar29 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._5100_32_,auVar29);
  auVar34._8_4_ = 0x3d638e39;
  auVar34._0_8_ = 0x3d638e393d638e39;
  auVar34._12_4_ = 0x3d638e39;
  auVar34._16_4_ = 0x3d638e39;
  auVar34._20_4_ = 0x3d638e39;
  auVar34._24_4_ = 0x3d638e39;
  auVar34._28_4_ = 0x3d638e39;
  auVar32 = vmulps_avx512vl(auVar30,auVar34);
  auVar33 = vmulps_avx512vl(auVar27,auVar34);
  auVar34 = vmulps_avx512vl(auVar29,auVar34);
  auVar27 = vblendps_avx(auVar32,ZEXT832(0) << 0x20,1);
  auVar29 = vblendps_avx(auVar33,ZEXT832(0) << 0x20,1);
  auVar37 = ZEXT832(0) << 0x20;
  auVar30 = vblendps_avx(auVar34,auVar37,1);
  auVar31 = vsubps_avx(ZEXT1632(auVar19),auVar27);
  auVar35 = vsubps_avx512vl(auVar39,auVar29);
  auVar36 = vsubps_avx512vl(auVar40,auVar30);
  auVar27 = vblendps_avx(auVar32,auVar37,0x80);
  auVar29 = vblendps_avx(auVar33,auVar37,0x80);
  auVar30 = vblendps_avx(auVar34,auVar37,0x80);
  auVar33 = vaddps_avx512vl(ZEXT1632(auVar19),auVar27);
  auVar29 = vaddps_avx512vl(auVar39,auVar29);
  auVar30 = vaddps_avx512vl(auVar40,auVar30);
  auVar79._8_4_ = 0x7f800000;
  auVar79._0_8_ = 0x7f8000007f800000;
  auVar79._12_4_ = 0x7f800000;
  auVar79._16_4_ = 0x7f800000;
  auVar79._20_4_ = 0x7f800000;
  auVar79._24_4_ = 0x7f800000;
  auVar79._28_4_ = 0x7f800000;
  auVar27 = vminps_avx(auVar79,ZEXT1632(auVar19));
  auVar34 = vminps_avx512vl(auVar79,auVar39);
  auVar37 = vminps_avx512vl(auVar79,auVar40);
  auVar32 = vminps_avx512vl(auVar31,auVar33);
  auVar32 = vminps_avx(auVar27,auVar32);
  auVar27 = vminps_avx512vl(auVar35,auVar29);
  auVar38 = vminps_avx512vl(auVar34,auVar27);
  auVar27 = vminps_avx512vl(auVar36,auVar30);
  auVar37 = vminps_avx512vl(auVar37,auVar27);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar27 = vmaxps_avx512vl(auVar41,ZEXT1632(auVar19));
  auVar34 = vmaxps_avx512vl(auVar41,auVar39);
  auVar39 = vmaxps_avx512vl(auVar41,auVar40);
  auVar31 = vmaxps_avx512vl(auVar31,auVar33);
  auVar40 = vmaxps_avx512vl(auVar27,auVar31);
  auVar27 = vmaxps_avx512vl(auVar35,auVar29);
  auVar42 = vmaxps_avx512vl(auVar34,auVar27);
  auVar27 = vmaxps_avx512vl(auVar36,auVar30);
  auVar39 = vmaxps_avx512vl(auVar39,auVar27);
  auVar27 = vbroadcastss_avx512vl(auVar22);
  auVar29 = vpermps_avx512vl(auVar26,ZEXT1632(auVar22));
  auVar30 = vpermps_avx512vl(auVar28,ZEXT1632(auVar22));
  auVar31 = vbroadcastss_avx512vl(auVar24);
  auVar33 = vpermps_avx512vl(auVar26,ZEXT1632(auVar24));
  auVar34 = vpermps_avx512vl(auVar28,ZEXT1632(auVar24));
  auVar35 = vbroadcastss_avx512vl(auVar23);
  auVar36 = vpermps_avx512vl(auVar26,ZEXT1632(auVar23));
  auVar43 = vpermps_avx512vl(auVar28,ZEXT1632(auVar23));
  uVar54 = auVar25._0_4_;
  auVar53._4_4_ = uVar54;
  auVar53._0_4_ = uVar54;
  auVar53._8_4_ = uVar54;
  auVar53._12_4_ = uVar54;
  auVar53._16_4_ = uVar54;
  auVar53._20_4_ = uVar54;
  auVar53._24_4_ = uVar54;
  auVar53._28_4_ = uVar54;
  auVar26 = vpermps_avx512vl(auVar26,ZEXT1632(auVar25));
  auVar28 = vpermps_avx512vl(auVar28,ZEXT1632(auVar25));
  auVar44 = vmulps_avx512vl(auVar53,bezier_basis0._3944_32_);
  auVar45 = vmulps_avx512vl(auVar26,bezier_basis0._3944_32_);
  auVar46 = vmulps_avx512vl(auVar28,bezier_basis0._3944_32_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._2788_32_,auVar35);
  auVar45 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._2788_32_,auVar36);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar43,bezier_basis0._2788_32_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._1632_32_,auVar31);
  auVar45 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._1632_32_,auVar33);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar34,bezier_basis0._1632_32_);
  auVar25 = vfmadd231ps_fma(auVar44,bezier_basis0._476_32_,auVar27);
  auVar44 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._476_32_,auVar29);
  auVar45 = vfmadd231ps_avx512vl(auVar46,auVar30,bezier_basis0._476_32_);
  auVar46 = vmulps_avx512vl(auVar53,bezier_basis0._8568_32_);
  auVar26 = vmulps_avx512vl(auVar26,bezier_basis0._8568_32_);
  auVar28 = vmulps_avx512vl(auVar28,bezier_basis0._8568_32_);
  auVar35 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._7412_32_,auVar35);
  auVar26 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._7412_32_,auVar36);
  auVar28 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._7412_32_,auVar43);
  auVar31 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._6256_32_,auVar31);
  auVar26 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._6256_32_,auVar33);
  auVar28 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._6256_32_,auVar34);
  auVar19 = vfmadd231ps_fma(auVar31,bezier_basis0._5100_32_,auVar27);
  auVar27 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._5100_32_,auVar29);
  auVar29 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._5100_32_,auVar30);
  auVar28 = ZEXT1632(CONCAT412(auVar19._12_4_ * 0.055555556,
                               CONCAT48(auVar19._8_4_ * 0.055555556,
                                        CONCAT44(auVar19._4_4_ * 0.055555556,
                                                 auVar19._0_4_ * 0.055555556))));
  auVar31._4_4_ = auVar27._4_4_ * 0.055555556;
  auVar31._0_4_ = auVar27._0_4_ * 0.055555556;
  auVar31._8_4_ = auVar27._8_4_ * 0.055555556;
  auVar31._12_4_ = auVar27._12_4_ * 0.055555556;
  auVar31._16_4_ = auVar27._16_4_ * 0.055555556;
  auVar31._20_4_ = auVar27._20_4_ * 0.055555556;
  auVar31._24_4_ = auVar27._24_4_ * 0.055555556;
  auVar31._28_4_ = auVar27._28_4_;
  auVar26._4_4_ = auVar29._4_4_ * 0.055555556;
  auVar26._0_4_ = auVar29._0_4_ * 0.055555556;
  auVar26._8_4_ = auVar29._8_4_ * 0.055555556;
  auVar26._12_4_ = auVar29._12_4_ * 0.055555556;
  auVar26._16_4_ = auVar29._16_4_ * 0.055555556;
  auVar26._20_4_ = auVar29._20_4_ * 0.055555556;
  auVar26._24_4_ = auVar29._24_4_ * 0.055555556;
  auVar26._28_4_ = 0x3d638e39;
  auVar33 = ZEXT832(0) << 0x20;
  auVar27 = vblendps_avx(auVar28,auVar33,1);
  auVar29 = vblendps_avx(auVar31,auVar33,1);
  auVar30 = vblendps_avx(auVar26,auVar33,1);
  auVar34 = vsubps_avx(ZEXT1632(auVar25),auVar27);
  auVar35 = vsubps_avx(auVar44,auVar29);
  auVar36 = vsubps_avx(auVar45,auVar30);
  auVar27 = vblendps_avx(auVar28,auVar33,0x80);
  auVar29 = vblendps_avx(auVar31,auVar33,0x80);
  auVar30 = vblendps_avx(auVar26,auVar33,0x80);
  auVar43._0_4_ = auVar25._0_4_ + auVar27._0_4_;
  auVar43._4_4_ = auVar25._4_4_ + auVar27._4_4_;
  auVar43._8_4_ = auVar25._8_4_ + auVar27._8_4_;
  auVar43._12_4_ = auVar25._12_4_ + auVar27._12_4_;
  auVar43._16_4_ = auVar27._16_4_ + 0.0;
  auVar43._20_4_ = auVar27._20_4_ + 0.0;
  auVar43._24_4_ = auVar27._24_4_ + 0.0;
  auVar43._28_4_ = auVar27._28_4_ + 0.0;
  auVar46._0_4_ = auVar44._0_4_ + auVar29._0_4_;
  auVar46._4_4_ = auVar44._4_4_ + auVar29._4_4_;
  auVar46._8_4_ = auVar44._8_4_ + auVar29._8_4_;
  auVar46._12_4_ = auVar44._12_4_ + auVar29._12_4_;
  auVar46._16_4_ = auVar44._16_4_ + auVar29._16_4_;
  auVar46._20_4_ = auVar44._20_4_ + auVar29._20_4_;
  auVar46._24_4_ = auVar44._24_4_ + auVar29._24_4_;
  auVar46._28_4_ = auVar44._28_4_ + auVar29._28_4_;
  auVar98._0_4_ = auVar45._0_4_ + auVar30._0_4_;
  auVar98._4_4_ = auVar45._4_4_ + auVar30._4_4_;
  auVar98._8_4_ = auVar45._8_4_ + auVar30._8_4_;
  auVar98._12_4_ = auVar45._12_4_ + auVar30._12_4_;
  auVar98._16_4_ = auVar45._16_4_ + auVar30._16_4_;
  auVar98._20_4_ = auVar45._20_4_ + auVar30._20_4_;
  auVar98._24_4_ = auVar45._24_4_ + auVar30._24_4_;
  auVar98._28_4_ = auVar45._28_4_ + auVar30._28_4_;
  auVar27 = vminps_avx(auVar79,ZEXT1632(auVar25));
  auVar29 = vminps_avx(auVar79,auVar44);
  auVar30 = vminps_avx(auVar79,auVar45);
  auVar31 = vminps_avx(auVar34,auVar43);
  auVar26 = vminps_avx(auVar27,auVar31);
  auVar27 = vminps_avx(auVar35,auVar46);
  auVar28 = vminps_avx(auVar29,auVar27);
  auVar27 = vminps_avx(auVar36,auVar98);
  auVar33 = vminps_avx(auVar30,auVar27);
  auVar29 = vmaxps_avx512vl(auVar41,ZEXT1632(auVar25));
  auVar30 = vmaxps_avx512vl(auVar41,auVar44);
  auVar31 = vmaxps_avx512vl(auVar41,auVar45);
  auVar27 = vmaxps_avx(auVar34,auVar43);
  auVar27 = vmaxps_avx(auVar29,auVar27);
  auVar29 = vmaxps_avx(auVar35,auVar46);
  auVar29 = vmaxps_avx(auVar30,auVar29);
  auVar30 = vmaxps_avx(auVar36,auVar98);
  auVar30 = vmaxps_avx(auVar31,auVar30);
  auVar31 = vshufps_avx512vl(auVar40,auVar40,0xb1);
  auVar34 = vmaxps_avx512vl(auVar40,auVar31);
  auVar31 = vshufpd_avx(auVar34,auVar34,5);
  auVar31 = vmaxps_avx(auVar34,auVar31);
  auVar25 = vmaxps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar31 = vshufps_avx512vl(auVar42,auVar42,0xb1);
  auVar34 = vmaxps_avx512vl(auVar42,auVar31);
  auVar31 = vshufpd_avx(auVar34,auVar34,5);
  auVar31 = vmaxps_avx(auVar34,auVar31);
  auVar19 = vmaxps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar19 = vunpcklps_avx(auVar25,auVar19);
  auVar31 = vshufps_avx(auVar39,auVar39,0xb1);
  auVar31 = vmaxps_avx(auVar39,auVar31);
  auVar34 = vshufpd_avx(auVar31,auVar31,5);
  auVar31 = vmaxps_avx(auVar31,auVar34);
  auVar25 = vmaxps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar25 = vinsertps_avx(auVar19,auVar25,0x28);
  auVar31 = vshufps_avx(auVar32,auVar32,0xb1);
  auVar31 = vminps_avx(auVar32,auVar31);
  auVar32 = vshufpd_avx(auVar31,auVar31,5);
  auVar31 = vminps_avx(auVar31,auVar32);
  auVar19 = vminps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar31 = vshufps_avx(auVar38,auVar38,0xb1);
  auVar31 = vminps_avx(auVar38,auVar31);
  auVar32 = vshufpd_avx(auVar31,auVar31,5);
  auVar31 = vminps_avx(auVar31,auVar32);
  auVar23 = vminps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar23 = vunpcklps_avx(auVar19,auVar23);
  auVar31 = vshufps_avx512vl(auVar37,auVar37,0xb1);
  auVar32 = vminps_avx512vl(auVar37,auVar31);
  auVar31 = vshufpd_avx(auVar32,auVar32,5);
  auVar31 = vminps_avx(auVar32,auVar31);
  auVar19 = vminps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar19 = vinsertps_avx(auVar23,auVar19,0x28);
  auVar31 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar31 = vminps_avx(auVar26,auVar31);
  auVar32 = vshufpd_avx(auVar31,auVar31,5);
  auVar31 = vminps_avx(auVar31,auVar32);
  auVar23 = vminps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar31 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar31 = vminps_avx(auVar28,auVar31);
  auVar32 = vshufpd_avx(auVar31,auVar31,5);
  auVar31 = vminps_avx(auVar31,auVar32);
  auVar21 = vminps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar21 = vunpcklps_avx(auVar23,auVar21);
  auVar31 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar31 = vminps_avx(auVar33,auVar31);
  auVar32 = vshufpd_avx(auVar31,auVar31,5);
  auVar31 = vminps_avx(auVar31,auVar32);
  auVar23 = vminps_avx(auVar31._0_16_,auVar31._16_16_);
  auVar23 = vinsertps_avx(auVar21,auVar23,0x28);
  auVar21 = vminps_avx(auVar19,auVar23);
  auVar31 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vmaxps_avx(auVar27,auVar31);
  auVar31 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vmaxps_avx(auVar27,auVar31);
  auVar19 = vmaxps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar27 = vshufps_avx(auVar29,auVar29,0xb1);
  auVar27 = vmaxps_avx(auVar29,auVar27);
  auVar29 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vmaxps_avx(auVar27,auVar29);
  auVar23 = vmaxps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar23 = vunpcklps_avx(auVar19,auVar23);
  auVar27 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar27 = vmaxps_avx(auVar30,auVar27);
  auVar29 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vmaxps_avx(auVar27,auVar29);
  auVar19 = vmaxps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar19 = vinsertps_avx(auVar23,auVar19,0x28);
  auVar23 = vmaxps_avx(auVar25,auVar19);
  auVar19._8_4_ = 0x7fffffff;
  auVar19._0_8_ = 0x7fffffff7fffffff;
  auVar19._12_4_ = 0x7fffffff;
  auVar25 = vandps_avx(auVar21,auVar19);
  auVar19 = vandps_avx(auVar23,auVar19);
  auVar25 = vmaxps_avx(auVar25,auVar19);
  auVar19 = vmovshdup_avx(auVar25);
  auVar19 = vmaxss_avx(auVar19,auVar25);
  auVar25 = vshufpd_avx(auVar25,auVar25,1);
  auVar25 = vmaxss_avx(auVar25,auVar19);
  fVar77 = auVar25._0_4_ * 4.7683716e-07;
  auVar25._4_4_ = fVar77;
  auVar25._0_4_ = fVar77;
  auVar25._8_4_ = fVar77;
  auVar25._12_4_ = fVar77;
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar21,auVar25);
  (__return_storage_ptr__->lower).field_0 = aVar1;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar23._0_4_ + fVar77;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar23._4_4_ + fVar77;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar23._8_4_ + fVar77;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar23._12_4_ + fVar77;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }